

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::DeleteDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  bool bVar1;
  AddressType AVar2;
  pointer ppVar3;
  uint8_t *buf;
  RTPMemoryManager *mgr;
  uint8_t *pBuf;
  _Self local_38;
  iterator it;
  SocketType s;
  RTPTCPAddress *a;
  RTPAddress *addr_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else {
    AVar2 = RTPAddress::GetAddressType(addr);
    if (AVar2 == TCPAddress) {
      it._M_node._4_4_ = RTPTCPAddress::GetSocket((RTPTCPAddress *)addr);
      if (it._M_node._4_4_ == 0) {
        this_local._4_4_ = -0xbd;
      }
      else {
        local_38._M_node =
             (_Base_ptr)
             std::
             map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
             ::find(&this->m_destSockets,(key_type *)((long)&it._M_node + 4));
        pBuf = (uint8_t *)
               std::
               map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
               ::end(&this->m_destSockets);
        bVar1 = std::operator==(&local_38,(_Self *)&pBuf);
        if (bVar1) {
          this_local._4_4_ = -0xc3;
        }
        else {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>
                   ::operator->(&local_38);
          buf = SocketData::ExtractDataBuffer(&ppVar3->second);
          if (buf != (uint8_t *)0x0) {
            mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
            RTPDeleteByteArray(buf,mgr);
          }
          std::
          map<int,jrtplib::RTPTCPTransmitter::SocketData,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
          ::erase_abi_cxx11_((map<int,jrtplib::RTPTCPTransmitter::SocketData,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
                              *)&this->m_destSockets,(iterator)local_38._M_node);
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      this_local._4_4_ = -0xbc;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	
	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it == m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETNOTFOUNDINDESTINATIONS;
	}

	// Clean up possibly allocated memory
	uint8_t *pBuf = it->second.ExtractDataBuffer();
	if (pBuf)
		RTPDeleteByteArray(pBuf, GetMemoryManager());

	m_destSockets.erase(it);

	MAINMUTEX_UNLOCK
	return 0;
}